

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O2

void Abc_CexPrintStats(Abc_Cex_t *p)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  if (p == (Abc_Cex_t *)0x0) {
    puts("The counter example is NULL.");
    return;
  }
  if (p == (Abc_Cex_t *)0x1) {
    puts("The counter example is present but not available (pointer has value \"1\").");
    return;
  }
  uVar1 = p->nBits;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  uVar2 = 0;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    uVar2 = (ulong)((int)uVar2 + (uint)(((uint)(&p[1].iPo)[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0))
    ;
  }
  printf("CEX: Po =%4d  Frame =%4d  FF = %d  PI = %d  Bit =%8d  1s =%8d (%5.2f %%)\n",
         ((double)(int)uVar2 * 100.0) / (double)(int)(uVar1 - p->nRegs),(ulong)(uint)p->iPo,
         (ulong)(uint)p->iFrame,(ulong)(uint)p->nRegs,(ulong)(uint)p->nPis,(ulong)uVar1,uVar2);
  return;
}

Assistant:

void Abc_CexPrintStats( Abc_Cex_t * p )
{
    int k, Counter = 0;
    if ( p == NULL )
    {
        printf( "The counter example is NULL.\n" );
        return;
    }
    if ( p == (Abc_Cex_t *)(ABC_PTRINT_T)1 )
    {
        printf( "The counter example is present but not available (pointer has value \"1\").\n" );
        return;
    }
    for ( k = 0; k < p->nBits; k++ )
        Counter += Abc_InfoHasBit(p->pData, k);
    printf( "CEX: Po =%4d  Frame =%4d  FF = %d  PI = %d  Bit =%8d  1s =%8d (%5.2f %%)\n", 
        p->iPo, p->iFrame, p->nRegs, p->nPis, p->nBits, 
        Counter, 100.0 * Counter / (p->nBits - p->nRegs) );
}